

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O0

bool __thiscall asl::TabularDataFile::nextRow(TabularDataFile *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint y;
  Array<asl::String> *this_00;
  EnumWrapper<const_asl::Array<asl::String>_> *pEVar4;
  char *pcVar5;
  Array<asl::String> *e;
  double dVar6;
  Var local_110;
  Var local_100;
  Var local_f0;
  Var local_e0;
  Var local_d0;
  Var local_c0;
  int local_ac;
  String *pSStack_a8;
  int i;
  String *v;
  EnumWrapper_ *local_88;
  EnumWrapper_ *_b_;
  int ntypes;
  char decimal;
  String value;
  State state;
  char c;
  char *p;
  Array<asl::String> *row;
  String local_38;
  String *local_20;
  String *line;
  TabularDataFile *this_local;
  
  local_20 = &this->_currentLine;
  line = (String *)this;
  bVar1 = File::operator!((File *)this);
  if ((!bVar1) || (bVar1 = readHeader(this), bVar1)) {
    bVar1 = TextFile::end(&this->_file);
    if ((bVar1) || (bVar1 = TextFile::readLine(&this->_file,local_20), !bVar1)) {
      this_local._7_1_ = 0;
    }
    else {
      if ((((this->_dataStarted & 1U) == 0) && (iVar3 = asl::String::length(local_20), 2 < iVar3))
         && (bVar1 = asl::String::startsWith(local_20,anon_var_dwarf_695ee), bVar1)) {
        asl::String::substr(&local_38,local_20,3);
        asl::String::operator=(local_20,&local_38);
        asl::String::~String(&local_38);
      }
      this_00 = &this->_currentRowParts;
      Array<asl::String>::clear(this_00);
      _state = asl::String::data(local_20);
      value.field_2._space[0xf] = ' ';
      value.field_2._8_4_ = 0;
      asl::String::String((String *)&ntypes);
      while( true ) {
        pcVar5 = _state + 1;
        value.field_2._space[0xf] = *_state;
        if (value.field_2._space[0xf] == '\0') break;
        _state = pcVar5;
        if (value.field_2._8_4_ == 0) {
          if (value.field_2._space[0xf] == '\"') {
            value.field_2._8_4_ = 1;
          }
          else if (value.field_2._space[0xf] == this->_separator) {
            Array<asl::String>::operator<<(this_00,(String *)&ntypes);
            asl::String::operator=((String *)&ntypes,"");
          }
          else {
            asl::String::operator<<((String *)&ntypes,value.field_2._space[0xf]);
          }
        }
        else if (value.field_2._8_4_ == 1) {
          if (value.field_2._space[0xf] == '\"') {
            value.field_2._8_4_ = 2;
          }
          else {
            asl::String::operator<<((String *)&ntypes,value.field_2._space[0xf]);
          }
        }
        else if (value.field_2._8_4_ == 2) {
          if (value.field_2._space[0xf] == '\"') {
            asl::String::operator<<((String *)&ntypes,'\"');
            value.field_2._8_4_ = 1;
          }
          else {
            bVar1 = value.field_2._space[0xf] != this->_separator;
            if (!bVar1) {
              Array<asl::String>::operator<<(this_00,(String *)&ntypes);
              asl::String::operator=((String *)&ntypes,"");
            }
            value.field_2._9_3_ = 0;
            value.field_2._space[8] = bVar1;
          }
        }
        else {
          asl::String::operator<<((String *)&ntypes,value.field_2._space[0xf]);
        }
      }
      Array<asl::String>::operator<<(this_00,(String *)&ntypes);
      Array<asl::Var>::clear(&this->_row);
      _b_._7_1_ = this->_decimal;
      _b_._0_4_ = asl::String::length(&this->_types);
      newEnumerator<asl::Array<asl::String>>
                ((EnumWrapper<asl::Array<asl::String>_> *)&v,(asl *)this_00,e);
      local_88 = (EnumWrapper_ *)&v;
      while( true ) {
        pEVar4 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_88);
        bVar2 = EnumWrapper::operator_cast_to_bool((EnumWrapper *)pEVar4);
        bVar1 = false;
        if (bVar2) {
          bVar1 = local_88->more != 0;
        }
        if (!bVar1) break;
        pEVar4 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_88);
        pSStack_a8 = Array<asl::String>::Enumerator::operator*((Enumerator *)(pEVar4 + 8));
        while (0 < local_88->more) {
          pEVar4 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_88);
          local_ac = Array<asl::String>::Enumerator::operator~((Enumerator *)(pEVar4 + 8));
          while (local_88->more != 0) {
            if (local_ac < (int)_b_) {
              pcVar5 = asl::String::operator[](&this->_types,local_ac);
              switch(*pcVar5) {
              case 'h':
                y = asl::String::hexToInt(pSStack_a8);
                Var::Var(&local_f0,y);
                Array<asl::Var>::operator<<(&this->_row,&local_f0);
                Var::~Var(&local_f0);
                break;
              case 'i':
                pcVar5 = asl::String::operator*(pSStack_a8);
                iVar3 = myatoi(pcVar5);
                Var::Var(&local_e0,iVar3);
                Array<asl::Var>::operator<<(&this->_row,&local_e0);
                Var::~Var(&local_e0);
                break;
              case 'n':
                if (_b_._7_1_ != '.') {
                  asl::String::replaceme(pSStack_a8,_b_._7_1_,'.');
                }
                pcVar5 = asl::String::operator*(pSStack_a8);
                dVar6 = myatof(pcVar5);
                Var::Var(&local_c0,dVar6);
                Array<asl::Var>::operator<<(&this->_row,&local_c0);
                Var::~Var(&local_c0);
                break;
              case 's':
                Var::Var(&local_d0,pSStack_a8);
                Array<asl::Var>::operator<<(&this->_row,&local_d0);
                Var::~Var(&local_d0);
              }
            }
            else {
              bVar1 = myisnumber(pSStack_a8,_b_._7_1_);
              if (bVar1) {
                if (_b_._7_1_ != '.') {
                  asl::String::replaceme(pSStack_a8,_b_._7_1_,'.');
                }
                pcVar5 = asl::String::operator*(pSStack_a8);
                dVar6 = myatof(pcVar5);
                Var::Var(&local_100,dVar6);
                Array<asl::Var>::operator<<(&this->_row,&local_100);
                Var::~Var(&local_100);
              }
              else {
                Var::Var(&local_110,pSStack_a8);
                Array<asl::Var>::operator<<(&this->_row,&local_110);
                Var::~Var(&local_110);
              }
            }
            local_88->more = local_88->more + -1;
          }
          local_88->more = local_88->more + -2;
        }
        pEVar4 = enumData<asl::Array<asl::String>const>((Array<asl::String> *)0x0,local_88);
        Array<asl::String>::Enumerator::operator++((Enumerator *)(pEVar4 + 8));
        local_88->more = -1 - local_88->more;
      }
      this->_dataStarted = true;
      this_local._7_1_ = 1;
      asl::String::~String((String *)&ntypes);
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool TabularDataFile::nextRow()
{
	String& line = _currentLine;
	if(!_file)
	{
		if (!readHeader())
			return false;
	}
	if (_file.end() || !_file.readLine(line))
		return false;
	
	if (!_dataStarted && line.length() >= 3 && line.startsWith("\xef\xbb\xbf")) // eat BOM
		line = line.substr(3);
	
	Array<String>& row = _currentRowParts;

	row.clear();
	const char* p = line.data();
	char        c = ' ';
	State       state = BASE;
	String      value;
	while ((c = *p++))
	{
		switch (state)
		{
		case BASE:
			if (c == '"')
				state = QUOTE;
			else if (c == _separator)
			{
				row << value;
				value = "";
			}
			else
				value << c;
			break;
		case QUOTE:
			if (c != '"')
			{
				value << c;
			}
			else
				state = QUOTE2;
			break;
		case QUOTE2:
			if (c == '"')
			{
				value << c;
				state = QUOTE;
			}
			else if (c == _separator)
			{
				row << value;
				value = "";
				state = BASE;
			}
			else
				state = QUOTE;
			break;
		default:
			value << c;
		}
	}

	row << value;

	_row.clear();
	char decimal = _decimal;
	int ntypes = _types.length();
	
	foreach2(int i, String& v, row)
	{
		if(ntypes > i)
		{
			switch(_types[i])
			{
			case 'n':
				if (decimal != '.')
					v.replaceme(decimal, '.');
				_row << myatof(*v);
				break;
			case 's':
				_row << v;
				break;
			case 'i':
				_row << myatoi(*v);
				break;
			case 'h':
				_row << v.hexToInt();
				break;
			}
		}
		else
		{
			if (myisnumber(v, decimal))
			{
				if (decimal != '.')
					v.replaceme(decimal, '.');
					_row << myatof(*v);
			}
			else
				_row << v;
		}
	}
	_dataStarted = true;
	return true;
}